

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaQbf.c
# Opt level: O2

void Gia_QbfDumpFile(Gia_Man_t *pGia,int nPars)

{
  int *piVar1;
  int iVar2;
  Cnf_Dat_t *p;
  Vec_Int_t *p_00;
  Gia_Obj_t *pGVar3;
  Vec_Int_t *vForAlls;
  Vec_Int_t *vExists;
  char *pFileName;
  int nCap;
  Vec_Int_t *p_01;
  int iVar4;
  
  p = (Cnf_Dat_t *)Mf_ManGenerateCnf(pGia,8,0,1,0,0);
  nCap = p->nVars;
  p_00 = Vec_IntAlloc(nCap);
  p_00->nSize = nCap;
  iVar4 = 0;
  if (p_00->pArray != (int *)0x0) {
    memset(p_00->pArray,0,(long)nCap << 2);
    iVar4 = 0;
  }
  for (; iVar4 < pGia->vCis->nSize; iVar4 = iVar4 + 1) {
    pGVar3 = Gia_ManCi(pGia,iVar4);
    if (pGVar3 == (Gia_Obj_t *)0x0) break;
    if (iVar4 < nPars) {
      piVar1 = p->pVarNums;
      pGVar3 = Gia_ManCi(pGia,iVar4);
      iVar2 = Gia_ObjId(pGia,pGVar3);
      Vec_IntWriteEntry(p_00,piVar1[iVar2],1);
    }
  }
  vForAlls = Vec_IntAlloc(nPars);
  vExists = Vec_IntAlloc(pGia->vCis->nSize - nPars);
  iVar4 = 0;
  if (nCap < 1) {
    nCap = iVar4;
  }
  for (; nCap != iVar4; iVar4 = iVar4 + 1) {
    iVar2 = Vec_IntEntry(p_00,iVar4);
    p_01 = vForAlls;
    if (iVar2 == 0) {
      p_01 = vExists;
    }
    Vec_IntPush(p_01,iVar4);
  }
  pFileName = Extra_FileNameGenericAppend(pGia->pSpec,".qdimacs");
  Cnf_DataWriteIntoFile(p,pFileName,0,vForAlls,vExists);
  Cnf_DataFree(p);
  Vec_IntFree(vForAlls);
  Vec_IntFree(vExists);
  Vec_IntFree(p_00);
  printf("The 2QBF formula was written into file \"%s\".\n",pFileName);
  return;
}

Assistant:

void Gia_QbfDumpFile( Gia_Man_t * pGia, int nPars )
{
    // original problem: \exists p \forall x \exists y.  M(p,x,y)
    // negated problem:  \forall p \exists x \exists y. !M(p,x,y)
    Cnf_Dat_t * pCnf = (Cnf_Dat_t *)Mf_ManGenerateCnf( pGia, 8, 0, 1, 0, 0 );
    Vec_Int_t * vVarMap, * vForAlls, * vExists;
    Gia_Obj_t * pObj;
    char * pFileName;
    int i, Entry;
    // create var map
    vVarMap = Vec_IntStart( pCnf->nVars );
    Gia_ManForEachCi( pGia, pObj, i )
        if ( i < nPars )
            Vec_IntWriteEntry( vVarMap, pCnf->pVarNums[Gia_ManCiIdToId(pGia, i)], 1 );
    // create various maps
    vForAlls = Vec_IntAlloc( nPars );
    vExists = Vec_IntAlloc( Gia_ManCiNum(pGia) - nPars );
    Vec_IntForEachEntry( vVarMap, Entry, i )
        if ( Entry )
            Vec_IntPush( vForAlls, i );
        else
            Vec_IntPush( vExists, i );
    // generate CNF
    pFileName = Extra_FileNameGenericAppend( pGia->pSpec, ".qdimacs" );
    Cnf_DataWriteIntoFile( pCnf, pFileName, 0, vForAlls, vExists );
    Cnf_DataFree( pCnf );
    Vec_IntFree( vForAlls );
    Vec_IntFree( vExists );
    Vec_IntFree( vVarMap );
    printf( "The 2QBF formula was written into file \"%s\".\n", pFileName );
}